

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.c
# Opt level: O3

int wally_ec_sig_from_bytes
              (uchar *priv_key,size_t priv_key_len,uchar *bytes,size_t bytes_len,uint32_t flags,
              uchar *bytes_out,size_t len)

{
  uchar *puVar1;
  int iVar2;
  int iVar3;
  wally_operations *pwVar4;
  secp256k1_context_struct *ctx;
  leint32_t tmp;
  int recid;
  uchar extra_entropy [32];
  secp256k1_ecdsa_recoverable_signature sig_secp;
  char local_b4 [4];
  secp256k1_nonce_function local_b0;
  uchar *local_a8;
  uchar *local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  secp256k1_ecdsa_recoverable_signature local_71;
  
  pwVar4 = wally_ops();
  local_b0 = pwVar4->ec_nonce_fn;
  ctx = secp_ctx();
  iVar2 = -2;
  if (((((bytes_len == 0x20 && priv_key_len == 0x20) &&
         (bytes != (uchar *)0x0 && priv_key != (uchar *)0x0)) && ((flags & 3) - 1 < 2)) &&
      (bytes_out != (uchar *)0x0 && flags < 0x10)) && (0x41 - (ulong)(flags < 8) == len)) {
    if (ctx == (secp256k1_context_struct *)0x0) {
      iVar2 = -3;
    }
    else if ((flags & 2) == 0) {
      local_88 = 0;
      uStack_80 = 0;
      local_98 = 0;
      uStack_90 = 0;
      local_a0 = bytes_out + (7 < flags);
      local_a8 = bytes_out;
      iVar2 = secp256k1_ecdsa_sign_recoverable(ctx,&local_71,bytes,priv_key,local_b0,(void *)0x0);
      if (iVar2 != 0) {
        iVar2 = 1;
        do {
          puVar1 = local_a0;
          secp256k1_ecdsa_recoverable_signature_serialize_compact
                    (ctx,local_a0,(int *)local_b4,&local_71);
          if (((flags & 4) == 0) || (-1 < (char)*puVar1)) {
            wally_clear(&local_71,0x41);
            if (flags < 8) {
              return 0;
            }
            *local_a8 = local_b4[0] + '\x1f';
            return 0;
          }
          local_98 = CONCAT44(local_98._4_4_,iVar2);
          iVar3 = secp256k1_ecdsa_sign_recoverable(ctx,&local_71,bytes,priv_key,local_b0,&local_98);
          iVar2 = iVar2 + 1;
        } while (iVar3 != 0);
      }
      wally_clear(&local_71,0x41);
      iVar2 = secp256k1_ec_seckey_verify(ctx,priv_key);
      iVar2 = -1 - (uint)(iVar2 == 0);
    }
  }
  return iVar2;
}

Assistant:

int wally_ec_sig_from_bytes(const unsigned char *priv_key, size_t priv_key_len,
                            const unsigned char *bytes, size_t bytes_len,
                            uint32_t flags,
                            unsigned char *bytes_out, size_t len)
{
    wally_ec_nonce_t nonce_fn = wally_ops()->ec_nonce_fn;
    const secp256k1_context *ctx = secp_ctx();

    if (!priv_key || priv_key_len != EC_PRIVATE_KEY_LEN ||
        !bytes || bytes_len != EC_MESSAGE_HASH_LEN ||
        !is_valid_ec_type(flags) || flags & ~EC_FLAGS_ALL ||
        !bytes_out || len != get_expected_sig_len(flags))
        return WALLY_EINVAL;

    if (!ctx)
        return WALLY_ENOMEM;

    if (flags & EC_FLAG_SCHNORR) {
        if (flags & EC_FLAG_RECOVERABLE)
            return WALLY_EINVAL; /* Only ECDSA is supported for recoverable sigs */

#if 0 /*FIXME: Schnorr is unavailable in secp for now*/
        if (!secp256k1_schnorr_sign(ctx, bytes_out, bytes,
                                    priv_key, nonce_fn, NULL))
            return WALLY_EINVAL; /* Failed to sign */
        return WALLY_OK;
#endif
        return WALLY_EINVAL;
    } else {
        unsigned char extra_entropy[32] = {0}, *entropy_p = NULL;
        unsigned char *bytes_out_p = flags & EC_FLAG_RECOVERABLE ? bytes_out + 1 : bytes_out;
        uint32_t counter = 0;
        secp256k1_ecdsa_recoverable_signature sig_secp;
        int recid;

        while (true) {
            if (!secp256k1_ecdsa_sign_recoverable(ctx, &sig_secp, bytes, priv_key, nonce_fn, entropy_p)) {
                wally_clear(&sig_secp, sizeof(sig_secp));
                if (!secp256k1_ec_seckey_verify(ctx, priv_key))
                    return WALLY_EINVAL; /* invalid priv_key */
                return WALLY_ERROR;     /* Nonce function failed */
            }

            /* Note this function is documented as never failing */
            secp256k1_ecdsa_recoverable_signature_serialize_compact(ctx, bytes_out_p, &recid, &sig_secp);

            if (!(flags & EC_FLAG_GRIND_R) || *bytes_out_p < 0x80) {
                wally_clear(&sig_secp, sizeof(sig_secp));
                /* Note the following assumes the key is compressed */
                if (flags & EC_FLAG_RECOVERABLE)
                    bytes_out[0] = 27 + recid + 4;

                return WALLY_OK;
            }
            /* Incremement nonce to grind for low-R */
            entropy_p = extra_entropy;
            ++counter;
            uint32_to_le_bytes(counter, entropy_p);
        }
    }
}